

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

double __thiscall
HighsSparseMatrix::computeDot
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *array,HighsInt use_col)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  double dVar5;
  
  if (use_col < this->num_col_) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[use_col];
    lVar4 = (long)iVar1;
    iVar2 = piVar3[(long)use_col + 1];
    dVar5 = 0.0;
    if (iVar1 < iVar2) {
      do {
        dVar5 = dVar5 + (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start
                        [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar4]] *
                        (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
    }
    return dVar5;
  }
  return (array->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[use_col - this->num_col_];
}

Assistant:

double HighsSparseMatrix::computeDot(const std::vector<double>& array,
                                     const HighsInt use_col) const {
  assert(this->isColwise());
  double result = 0;
  if (use_col < this->num_col_) {
    for (HighsInt iEl = this->start_[use_col]; iEl < this->start_[use_col + 1];
         iEl++)
      result += array[this->index_[iEl]] * this->value_[iEl];
  } else {
    result = array[use_col - this->num_col_];
  }
  return result;
}